

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLoader.c
# Opt level: O0

UINT32 DataLoader_Read(DATA_LOADER *loader,UINT32 numBytes)

{
  UINT8 UVar1;
  UINT8 *pUVar2;
  uint local_20;
  UINT32 readBytes;
  UINT32 endOfs;
  UINT32 numBytes_local;
  DATA_LOADER *loader_local;
  
  if (loader->_status == '\x01') {
    local_20 = loader->_bytesLoaded + numBytes;
    if (local_20 < loader->_bytesLoaded) {
      local_20 = 0xffffffff;
    }
    if (loader->_bytesTotal < local_20) {
      local_20 = loader->_bytesTotal;
    }
    pUVar2 = (UINT8 *)realloc(loader->_data,(ulong)local_20);
    loader->_data = pUVar2;
    if (loader->_data == (UINT8 *)0x0) {
      loader_local._4_4_ = 0;
    }
    else {
      loader_local._4_4_ =
           (*loader->_callbacks->dread)
                     (loader->_context,loader->_data + loader->_bytesLoaded,
                      local_20 - loader->_bytesLoaded);
      if (loader_local._4_4_ == 0) {
        loader_local._4_4_ = 0;
      }
      else {
        loader->_bytesLoaded = loader_local._4_4_ + loader->_bytesLoaded;
        if ((loader->_bytesTotal <= loader->_bytesLoaded) ||
           (UVar1 = (*loader->_callbacks->deof)(loader->_context), UVar1 != '\0')) {
          DataLoader_CancelLoading(loader);
          loader->_status = '\x02';
        }
      }
    }
  }
  else {
    loader_local._4_4_ = 0;
  }
  return loader_local._4_4_;
}

Assistant:

UINT32 DataLoader_Read(DATA_LOADER *loader, UINT32 numBytes)
{
	UINT32 endOfs;
	UINT32 readBytes;

	if (loader->_status != DLSTAT_LOADING)
		return 0;

	endOfs = loader->_bytesLoaded + numBytes;
	if (endOfs < loader->_bytesLoaded)
		endOfs = (UINT32)-1;
	if (endOfs > loader->_bytesTotal)
		endOfs = loader->_bytesTotal;

	loader->_data = (UINT8 *)realloc(loader->_data,endOfs);
	if(loader->_data == NULL) {
		return 0;
	}

	numBytes = endOfs - loader->_bytesLoaded;
	readBytes = loader->_callbacks->dread(loader->_context,&loader->_data[loader->_bytesLoaded],numBytes);
	if(!readBytes) return 0;
	loader->_bytesLoaded += readBytes;

	/* Note: The check (loaded >= total) is necessary, as the EoF flag is set only when
	         reading *beyond* the end of the file. Stopping at the last byte doesn't set it. */
	if (loader->_bytesLoaded >= loader->_bytesTotal || loader->_callbacks->deof(loader->_context))
	{
		DataLoader_CancelLoading(loader);
		loader->_status = DLSTAT_LOADED;
	}

	return readBytes;
}